

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_perform(Curl_multi *multi,int *running_handles)

{
  Curl_easy *pCVar1;
  Curl_tree *pCVar2;
  curltime now_00;
  curltime cVar3;
  Curl_easy *datanext;
  sigpipe_ignore pipe_st;
  undefined1 auStack_48 [3];
  _Bool nosig;
  CURLMcode result;
  curltime now;
  Curl_tree *t;
  Curl_easy *pCStack_28;
  CURLMcode returncode;
  Curl_easy *data;
  int *running_handles_local;
  Curl_multi *multi_local;
  
  t._4_4_ = CURLM_OK;
  cVar3 = Curl_now();
  _auStack_48 = cVar3.tv_sec;
  now.tv_sec._0_4_ = cVar3.tv_usec;
  if ((multi == (Curl_multi *)0x0) || (multi->magic != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if (((byte)multi->field_0x1b1 >> 2 & 1) == 0) {
    pCStack_28 = multi->easyp;
    if (pCStack_28 != (Curl_easy *)0x0) {
      pipe_st._155_1_ = (*(ulong *)&(pCStack_28->set).field_0x8ba >> 0x20 & 1) != 0;
      sigpipe_ignore(pCStack_28,(sigpipe_ignore *)&datanext);
      do {
        pCVar1 = pCStack_28->next;
        if (((uint)((ulong)*(undefined8 *)&(pCStack_28->set).field_0x8ba >> 0x20) & 1) !=
            (uint)(pipe_st._155_1_ & 1)) {
          sigpipe_restore((sigpipe_ignore *)&datanext);
          sigpipe_ignore(pCStack_28,(sigpipe_ignore *)&datanext);
          pipe_st._155_1_ = (*(ulong *)&(pCStack_28->set).field_0x8ba >> 0x20 & 1) != 0;
        }
        pipe_st._156_4_ = multi_runsingle(multi,(curltime *)auStack_48,pCStack_28);
        if (pipe_st._156_4_ != CURLM_OK) {
          t._4_4_ = pipe_st._156_4_;
        }
        pCStack_28 = pCVar1;
      } while (pCVar1 != (Curl_easy *)0x0);
      sigpipe_restore((sigpipe_ignore *)&datanext);
    }
    do {
      cVar3.tv_usec = (int)now.tv_sec;
      cVar3.tv_sec = _auStack_48;
      cVar3._12_4_ = 0;
      pCVar2 = Curl_splaygetbest(cVar3,multi->timetree,(Curl_tree **)&now.tv_usec);
      multi->timetree = pCVar2;
      if (now._8_8_ != 0) {
        now_00.tv_usec = (int)now.tv_sec;
        now_00.tv_sec = _auStack_48;
        now_00._12_4_ = 0;
        add_next_timeout(now_00,multi,*(Curl_easy **)(now._8_8_ + 0x30));
      }
    } while (now._8_8_ != 0);
    *running_handles = multi->num_alive;
    if (t._4_4_ < CURLM_BAD_HANDLE) {
      t._4_4_ = Curl_update_timer(multi);
    }
    multi_local._4_4_ = t._4_4_;
  }
  else {
    multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_perform(struct Curl_multi *multi, int *running_handles)
{
  struct Curl_easy *data;
  CURLMcode returncode = CURLM_OK;
  struct Curl_tree *t;
  struct curltime now = Curl_now();

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  data = multi->easyp;
  if(data) {
    CURLMcode result;
    bool nosig = data->set.no_signal;
    SIGPIPE_VARIABLE(pipe_st);
    sigpipe_ignore(data, &pipe_st);
    /* Do the loop and only alter the signal ignore state if the next handle
       has a different NO_SIGNAL state than the previous */
    do {
      /* the current node might be unlinked in multi_runsingle(), get the next
         pointer now */
      struct Curl_easy *datanext = data->next;
      if(data->set.no_signal != nosig) {
        sigpipe_restore(&pipe_st);
        sigpipe_ignore(data, &pipe_st);
        nosig = data->set.no_signal;
      }
      result = multi_runsingle(multi, &now, data);
      if(result)
        returncode = result;
      data = datanext; /* operate on next handle */
    } while(data);
    sigpipe_restore(&pipe_st);
  }

  /*
   * Simply remove all expired timers from the splay since handles are dealt
   * with unconditionally by this function and curl_multi_timeout() requires
   * that already passed/handled expire times are removed from the splay.
   *
   * It is important that the 'now' value is set at the entry of this function
   * and not for the current time as it may have ticked a little while since
   * then and then we risk this loop to remove timers that actually have not
   * been handled!
   */
  do {
    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t)
      /* the removed may have another timeout in queue */
      (void)add_next_timeout(now, multi, t->payload);

  } while(t);

  *running_handles = multi->num_alive;

  if(CURLM_OK >= returncode)
    returncode = Curl_update_timer(multi);

  return returncode;
}